

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O3

int32_t __thiscall
icu_63::Transliterator::transliterate
          (Transliterator *this,Replaceable *text,int32_t start,int32_t limit)

{
  int iVar1;
  UTransPosition offsets;
  int32_t local_38;
  int32_t local_34;
  int32_t local_30;
  int32_t local_2c;
  
  local_2c = -1;
  if (start <= limit && -1 < start) {
    iVar1 = (*(text->super_UObject)._vptr_UObject[8])(text);
    if (limit <= iVar1) {
      local_38 = start;
      local_34 = limit;
      local_30 = start;
      local_2c = limit;
      (*(this->super_UObject)._vptr_UObject[0xc])(this,text,&local_38,0,1);
    }
  }
  return local_2c;
}

Assistant:

int32_t Transliterator::transliterate(Replaceable& text,
                                      int32_t start, int32_t limit) const {
    if (start < 0 ||
        limit < start ||
        text.length() < limit) {
        return -1;
    }

    UTransPosition offsets;
    offsets.contextStart= start;
    offsets.contextLimit = limit;
    offsets.start = start;
    offsets.limit = limit;
    filteredTransliterate(text, offsets, FALSE, TRUE);
    return offsets.limit;
}